

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::addCollisionObject
          (cbtCollisionWorld *this,cbtCollisionObject *collisionObject,int collisionFilterGroup,
          int collisionFilterMask)

{
  int iVar1;
  cbtCollisionObject **ptr;
  int iVar2;
  cbtCollisionObject **ppcVar3;
  long lVar4;
  undefined4 extraout_var;
  long lVar5;
  int iVar6;
  cbtVector3 maxAabb;
  cbtVector3 minAabb;
  cbtTransform trans;
  
  iVar2 = (this->m_collisionObjects).m_size;
  collisionObject->m_worldArrayIndex = iVar2;
  iVar1 = (this->m_collisionObjects).m_capacity;
  if (iVar2 == iVar1) {
    iVar6 = 1;
    if (iVar2 != 0) {
      iVar6 = iVar2 * 2;
    }
    if (iVar1 < iVar6) {
      if (iVar6 == 0) {
        ppcVar3 = (cbtCollisionObject **)0x0;
      }
      else {
        ppcVar3 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->m_collisionObjects).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppcVar3[lVar5] = (this->m_collisionObjects).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->m_collisionObjects).m_data;
      if (ptr != (cbtCollisionObject **)0x0) {
        if ((this->m_collisionObjects).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_collisionObjects).m_data = (cbtCollisionObject **)0x0;
      }
      (this->m_collisionObjects).m_ownsMemory = true;
      (this->m_collisionObjects).m_data = ppcVar3;
      (this->m_collisionObjects).m_capacity = iVar6;
    }
  }
  iVar2 = (this->m_collisionObjects).m_size;
  (this->m_collisionObjects).m_data[iVar2] = collisionObject;
  (this->m_collisionObjects).m_size = iVar2 + 1;
  trans.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[0].m_floats;
  trans.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[0].m_floats + 2);
  trans.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[1].m_floats;
  trans.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[1].m_floats + 2);
  trans.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[2].m_floats;
  trans.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[2].m_floats + 2);
  trans.m_origin.m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_origin.m_floats;
  trans.m_origin.m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_origin.m_floats + 2);
  (*collisionObject->m_collisionShape->_vptr_cbtCollisionShape[2])
            (collisionObject->m_collisionShape,&trans,&minAabb,&maxAabb);
  iVar2 = (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[2])
                    (this->m_broadphasePairCache,&minAabb,&maxAabb,
                     (ulong)(uint)collisionObject->m_collisionShape->m_shapeType,collisionObject,
                     (ulong)(uint)collisionFilterGroup,(ulong)(uint)collisionFilterMask,
                     this->m_dispatcher1);
  collisionObject->m_broadphaseHandle = (cbtBroadphaseProxy *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

void cbtCollisionWorld::addCollisionObject(cbtCollisionObject* collisionObject, int collisionFilterGroup, int collisionFilterMask)
{
	cbtAssert(collisionObject);

	//check that the object isn't already added
	cbtAssert(m_collisionObjects.findLinearSearch(collisionObject) == m_collisionObjects.size());
	cbtAssert(collisionObject->getWorldArrayIndex() == -1);  // do not add the same object to more than one collision world

	collisionObject->setWorldArrayIndex(m_collisionObjects.size());
	m_collisionObjects.push_back(collisionObject);

	//calculate new AABB
	cbtTransform trans = collisionObject->getWorldTransform();

	cbtVector3 minAabb;
	cbtVector3 maxAabb;
	collisionObject->getCollisionShape()->getAabb(trans, minAabb, maxAabb);

	int type = collisionObject->getCollisionShape()->getShapeType();
	collisionObject->setBroadphaseHandle(getBroadphase()->createProxy(
		minAabb,
		maxAabb,
		type,
		collisionObject,
		collisionFilterGroup,
		collisionFilterMask,
		m_dispatcher1));
}